

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_psbt.cpp
# Opt level: O3

void cfd::capi::ConvertToKeyData
               (string *pubkey,char *fingerprint,char *bip32_path,
               vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> *key_list)

{
  pointer pcVar1;
  bool bVar2;
  size_t sVar3;
  CfdException *pCVar4;
  Descriptor desc;
  KeyData key_data;
  allocator local_46a;
  allocator local_469;
  ByteData local_468;
  Pubkey local_450;
  undefined1 local_438 [360];
  KeyData local_2d0;
  KeyData local_180;
  
  core::KeyData::KeyData(&local_180);
  core::Descriptor::Parse
            ((Descriptor *)local_438,pubkey,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             0x0);
  core::Descriptor::GetKeyData(&local_2d0,(Descriptor *)local_438);
  core::KeyData::operator=(&local_180,&local_2d0);
  core::KeyData::~KeyData(&local_2d0);
  core::DescriptorNode::~DescriptorNode((DescriptorNode *)local_438);
  bVar2 = core::KeyData::IsValid(&local_180);
  if (!bVar2) {
    core::KeyData::KeyData((KeyData *)local_438,pubkey,-1,false);
    core::KeyData::operator=(&local_180,(KeyData *)local_438);
    core::KeyData::~KeyData((KeyData *)local_438);
  }
  core::KeyData::GetBip32Path_abi_cxx11_((string *)local_438,&local_180,kApostrophe,false);
  if (CONCAT44(local_438._12_4_,local_438._8_4_) == 0) {
    bVar2 = true;
  }
  else {
    core::KeyData::GetFingerprint((ByteData *)&local_2d0,&local_180);
    sVar3 = core::ByteData::GetDataSize((ByteData *)&local_2d0);
    bVar2 = sVar3 != 4;
    if (local_2d0.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_2d0.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  pcVar1 = local_438 + 0x10;
  if ((pointer)local_438._0_8_ != pcVar1) {
    operator_delete((void *)local_438._0_8_);
  }
  if (bVar2) {
    bVar2 = IsEmptyString(fingerprint);
    if (bVar2) {
      local_438._0_8_ = "cfdcapi_psbt.cpp";
      local_438._8_4_ = 0xd7;
      local_438._16_8_ = "ConvertToKeyData";
      core::logger::log<>((CfdSourceLocation *)local_438,kCfdLogLevelWarning,
                          "fingerprint is null or empty.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_438._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Failed to parameter. fingerprint is null or empty.","");
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_438);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    bVar2 = IsEmptyString(bip32_path);
    if (bVar2) {
      local_438._0_8_ = "cfdcapi_psbt.cpp";
      local_438._8_4_ = 0xdd;
      local_438._16_8_ = "ConvertToKeyData";
      core::logger::log<>((CfdSourceLocation *)local_438,kCfdLogLevelWarning,
                          "bip32_path is null or empty.");
      pCVar4 = (CfdException *)__cxa_allocate_exception(0x30);
      local_438._0_8_ = pcVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_438,"Failed to parameter. bip32_path is null or empty.","");
      core::CfdException::CfdException(pCVar4,kCfdIllegalArgumentError,(string *)local_438);
      __cxa_throw(pCVar4,&core::CfdException::typeinfo,core::CfdException::~CfdException);
    }
    core::Pubkey::Pubkey(&local_450,pubkey);
    std::__cxx11::string::string((string *)local_438,bip32_path,&local_469);
    std::__cxx11::string::string((string *)&local_2d0,fingerprint,&local_46a);
    core::ByteData::ByteData(&local_468,(string *)&local_2d0);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<cfd::core::Pubkey,std::__cxx11::string,cfd::core::ByteData>
              ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)key_list,&local_450,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438,
               &local_468);
    if (local_468.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_468.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer *)
        local_2d0.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start !=
        (pointer *)
        ((long)&local_2d0.pubkey_.data_.data_.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl + 0x10U))
    {
      operator_delete(local_2d0.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((pointer)local_438._0_8_ != pcVar1) {
      operator_delete((void *)local_438._0_8_);
    }
    if (local_450.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start == (pointer)0x0) goto LAB_00413a7f;
  }
  else {
    core::KeyData::ToString_abi_cxx11_((string *)local_438,&local_180,true,kApostrophe,false);
    std::vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>>::
    emplace_back<std::__cxx11::string>
              ((vector<cfd::core::KeyData,std::allocator<cfd::core::KeyData>> *)key_list,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_438);
    local_450.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)local_438._0_8_;
    if ((pointer)local_438._0_8_ == pcVar1) goto LAB_00413a7f;
  }
  operator_delete(local_450.data_.data_.
                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                  super__Vector_impl_data._M_start);
LAB_00413a7f:
  core::KeyData::~KeyData(&local_180);
  return;
}

Assistant:

static void ConvertToKeyData(
    const std::string& pubkey, const char* fingerprint, const char* bip32_path,
    std::vector<KeyData>* key_list) {
  KeyData key_data;
  try {
    auto desc = Descriptor::Parse(pubkey);
    key_data = desc.GetKeyData();
  } catch (const CfdException&) {
    // fall through
  }
  if (!key_data.IsValid()) key_data = KeyData(pubkey);

  if (key_data.GetBip32Path().empty() ||
      (key_data.GetFingerprint().GetDataSize() != 4)) {
    if (IsEmptyString(fingerprint)) {
      warn(CFD_LOG_SOURCE, "fingerprint is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. fingerprint is null or empty.");
    }
    if (IsEmptyString(bip32_path)) {
      warn(CFD_LOG_SOURCE, "bip32_path is null or empty.");
      throw CfdException(
          CfdError::kCfdIllegalArgumentError,
          "Failed to parameter. bip32_path is null or empty.");
    }
    key_list->emplace_back(
        Pubkey(pubkey), std::string(bip32_path), ByteData(fingerprint));
  } else {
    key_list->emplace_back(key_data.ToString());
  }
}